

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O2

int QtMWidgets::countRepeat(QString *str,int index,int maxCount)

{
  char16_t *pcVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (str->d).size;
  pcVar1 = (str->d).ptr + index;
  iVar2 = index + maxCount;
  if (lVar3 < iVar2) {
    iVar2 = (int)lVar3;
  }
  for (lVar3 = 1; (index + lVar3 < (long)iVar2 && (pcVar1[lVar3] == *pcVar1)); lVar3 = lVar3 + 1) {
  }
  return (int)lVar3;
}

Assistant:

static inline int
countRepeat( const QString &str, int index, int maxCount )
{
	int count = 1;

	const QChar ch( str.at( index ) );
	const int max = qMin( index + maxCount, str.size() );

	while( index + count < max && str.at( index + count ) == ch )
		++count;

	return count;
}